

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

int __thiscall BpTree<int>::FindFirstKey(BpTree<int> *this,int k,Addr *p)

{
  uint uVar1;
  int iVar2;
  pointer pcVar3;
  ulong uVar4;
  ulong uVar5;
  Addr p_00;
  size_t __n;
  bool bVar6;
  IndexNode<int> C;
  IndexNode<int> D;
  IndexNode<int> local_150;
  char local_f0;
  vector<int,_std::allocator<int>_> local_e8;
  _Vector_base<char,_std::allocator<char>_> local_d0;
  vector<Addr,_std::allocator<Addr>_> local_b8;
  Addr local_a0;
  Addr AStack_98;
  IndexNode<int> local_90;
  
  *p = this->RootAddr;
  IndexNode<int>::IndexNode(&local_150,this->N);
  IndexNode<int>::IndexNode(&local_90,this->N);
  FindNode(this,*p,&local_150);
  while( true ) {
    iVar2 = this->N;
    uVar1 = iVar2 - 1;
    if (local_150.NodeState == '1') break;
    uVar4 = 0;
    if (iVar2 < 2) {
LAB_0012ded2:
      if ((uint)uVar4 == uVar1) goto LAB_0012ded6;
      uVar4 = uVar4 & 0xffffffff;
      if (local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] == '0') goto LAB_0012deea;
      if (local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar4] == k) {
        FindNode(this,local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar4],&local_90);
        local_f0 = local_90.NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_e8,&local_90.k);
        local_d0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
                  (&local_d0,
                   (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
        pcVar3 = local_d0._M_impl.super__Vector_impl_data._M_start;
        __n = (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        if (__n != 0) {
          memmove(local_d0._M_impl.super__Vector_impl_data._M_start,
                  local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,__n);
        }
        local_d0._M_impl.super__Vector_impl_data._M_finish = pcVar3 + __n;
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_b8,&local_90.p);
        local_a0 = local_90.parent;
        AStack_98 = local_90.self;
        uVar1 = this->N - 1;
        uVar5 = 0;
        if (this->N < 2) {
LAB_0012e019:
          bVar6 = true;
          if ((uint)uVar5 != uVar1) {
            bVar6 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar5 & 0xffffffff] == '0';
          }
        }
        else {
          uVar5 = 0;
          do {
            if ((local_d0._M_impl.super__Vector_impl_data._M_start[uVar5] != '1') ||
               (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5] == k)) goto LAB_0012e019;
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
          bVar6 = true;
        }
        if (local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_d0._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (bVar6) {
          p_00 = local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4 + 1];
        }
        else {
          p_00 = local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4];
        }
        *p = p_00;
      }
      else {
        if (k < local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4]) goto LAB_0012deea;
        p_00 = *p;
      }
    }
    else {
      uVar4 = 0;
      do {
        if ((local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4] != '1') ||
           (k <= local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4])) goto LAB_0012ded2;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      uVar4 = (ulong)uVar1;
LAB_0012ded6:
      uVar4 = uVar4 & 0xffffffff;
LAB_0012deea:
      p_00 = local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
      *p = p_00;
    }
    FindNode(this,p_00,&local_150);
  }
  uVar4 = 0;
  if (1 < iVar2) {
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      if (k <= local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5]) break;
      uVar5 = uVar5 + 1;
      uVar4 = (ulong)uVar1;
    } while (uVar1 != uVar5);
  }
  if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (int)uVar4;
}

Assistant:

int BpTree<K>::FindFirstKey(K k, Addr& p) {
	int i, pos;
	p = this->RootAddr;
	IndexNode<K> C(N);
	IndexNode<K> D(N);
	this->FindNode(p, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			p = C.p[i];
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if (this->HaveK(D, k))
				p = C.p[i];			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				p = C.p[i + 1];		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			p = C.p[i];
		}
		this->FindNode(p, C);
	}
	for (pos = 0; pos < N - 1 && C.k[pos] < k; pos++);
	return pos;
}